

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getCoeff(Highs *this,HighsInt row,HighsInt col,double *value)

{
  uint uVar1;
  ulong uVar2;
  char *format;
  
  uVar2 = (ulong)(uint)row;
  if ((row < 0) || ((this->model_).lp_.num_row_ <= row)) {
    uVar1 = (this->model_).lp_.num_row_;
    format = "Row %d supplied to Highs::getCoeff is not in the range [0, %d]\n";
  }
  else {
    uVar1 = (this->model_).lp_.num_col_;
    if (-1 < col && col < (int)uVar1) {
      getCoefficientInterface(this,row,col,value);
      return kOk;
    }
    format = "Col %d supplied to Highs::getCoeff is not in the range [0, %d]\n";
    uVar2 = (ulong)(uint)col;
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format,uVar2,
               (ulong)uVar1);
  return kError;
}

Assistant:

HighsStatus Highs::getCoeff(const HighsInt row, const HighsInt col,
                            double& value) const {
  if (row < 0 || row >= model_.lp_.num_row_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Row %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        row, model_.lp_.num_row_);
    return HighsStatus::kError;
  }
  if (col < 0 || col >= model_.lp_.num_col_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Col %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        col, model_.lp_.num_col_);
    return HighsStatus::kError;
  }
  getCoefficientInterface(row, col, value);
  return HighsStatus::kOk;
}